

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::AllOfMatcherImpl<const_char_&>::MatchAndExplain
          (AllOfMatcherImpl<const_char_&> *this,char *x,MatchResultListener *listener)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  MatcherBase<const_char_&> *this_00;
  ulong uVar4;
  string local_258;
  undefined1 local_238 [8];
  string result;
  undefined1 local_1e8 [8];
  StringMatchResultListener slistener;
  size_t i;
  string all_match_result;
  MatchResultListener *listener_local;
  char *x_local;
  AllOfMatcherImpl<const_char_&> *this_local;
  
  all_match_result.field_2._8_8_ = listener;
  std::__cxx11::string::string((string *)&i);
  slistener._400_8_ = 0;
  while( true ) {
    uVar1 = slistener._400_8_;
    sVar3 = std::
            vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
            ::size(&this->matchers_);
    if (sVar3 <= (ulong)uVar1) break;
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1e8);
    this_00 = &std::
               vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
               ::operator[](&this->matchers_,slistener._400_8_)->super_MatcherBase<const_char_&>;
    bVar2 = MatcherBase<const_char_&>::MatchAndExplain(this_00,x,(MatchResultListener *)local_1e8);
    uVar1 = all_match_result.field_2._8_8_;
    if (bVar2) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        StringMatchResultListener::str_abi_cxx11_
                  ((string *)local_238,(StringMatchResultListener *)local_1e8);
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&i,", and ");
          std::__cxx11::string::operator+=((string *)&i,(string *)local_238);
        }
        std::__cxx11::string::~string((string *)local_238);
      }
      else {
        StringMatchResultListener::str_abi_cxx11_
                  ((string *)((long)&result.field_2 + 8),(StringMatchResultListener *)local_1e8);
        std::__cxx11::string::operator=((string *)&i,(string *)(result.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
      }
      bVar2 = false;
    }
    else {
      StringMatchResultListener::str_abi_cxx11_(&local_258,(StringMatchResultListener *)local_1e8);
      MatchResultListener::operator<<((MatchResultListener *)uVar1,&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      this_local._7_1_ = 0;
      bVar2 = true;
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1e8);
    if (bVar2) goto LAB_0015eadd;
    slistener._400_8_ = slistener._400_8_ + 1;
  }
  MatchResultListener::operator<<
            ((MatchResultListener *)all_match_result.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
  this_local._7_1_ = 1;
LAB_0015eadd:
  std::__cxx11::string::~string((string *)&i);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MatchAndExplain(const T& x,
                       MatchResultListener* listener) const override {
    // If either matcher1_ or matcher2_ doesn't match x, we only need
    // to explain why one of them fails.
    std::string all_match_result;

    for (size_t i = 0; i < matchers_.size(); ++i) {
      StringMatchResultListener slistener;
      if (matchers_[i].MatchAndExplain(x, &slistener)) {
        if (all_match_result.empty()) {
          all_match_result = slistener.str();
        } else {
          std::string result = slistener.str();
          if (!result.empty()) {
            all_match_result += ", and ";
            all_match_result += result;
          }
        }
      } else {
        *listener << slistener.str();
        return false;
      }
    }

    // Otherwise we need to explain why *both* of them match.
    *listener << all_match_result;
    return true;
  }